

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

bool __thiscall
cmCommonTargetGenerator::HaveRequiredLanguages
          (cmCommonTargetGenerator *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *sources,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languagesNeeded)

{
  pointer ppcVar1;
  cmMakefile *this_00;
  bool bVar2;
  cmState *this_01;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  pointer ppcVar5;
  string sStack_48;
  
  ppcVar1 = (sources->
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  for (ppcVar5 = (sources->
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar1; ppcVar5 = ppcVar5 + 1
      ) {
    cmSourceFile::GetLanguage_abi_cxx11_(&sStack_48,*ppcVar5);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)languagesNeeded,&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  this_00 = this->Makefile;
  this_01 = cmMakefile::GetState(this_00);
  p_Var3 = (languagesNeeded->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(languagesNeeded->_M_t)._M_impl.super__Rb_tree_header;
  do {
    if ((_Rb_tree_header *)p_Var3 == p_Var4) {
LAB_002f0233:
      return (_Rb_tree_header *)p_Var3 == p_Var4;
    }
    bVar2 = cmState::GetLanguageEnabled(this_01,(string *)(p_Var3 + 1));
    if (!bVar2) {
      cmStrCat<char_const(&)[14],std::__cxx11::string_const&,char_const(&)[169]>
                (&sStack_48,(char (*) [14])"The language ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1),
                 (char (*) [169])
                 " was requested for compilation but was not enabled. To enable a language it needs to be specified in a \'project\' or \'enable_language\' command in the root CMakeLists.txt"
                );
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&sStack_48);
      std::__cxx11::string::~string((string *)&sStack_48);
      goto LAB_002f0233;
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

bool cmCommonTargetGenerator::HaveRequiredLanguages(
  const std::vector<cmSourceFile const*>& sources,
  std::set<std::string>& languagesNeeded) const
{
  for (cmSourceFile const* sf : sources) {
    languagesNeeded.insert(sf->GetLanguage());
  }

  auto* makefile = this->Makefile;
  auto* state = makefile->GetState();
  auto unary = [&state, &makefile](const std::string& lang) -> bool {
    const bool valid = state->GetLanguageEnabled(lang);
    if (!valid) {
      makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("The language ", lang,
                 " was requested for compilation but was not enabled."
                 " To enable a language it needs to be specified in a"
                 " 'project' or 'enable_language' command in the root"
                 " CMakeLists.txt"));
    }
    return valid;
  };
  return std::all_of(languagesNeeded.cbegin(), languagesNeeded.cend(), unary);
}